

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__return_storage_ptr__,
          App *this,function<bool_(const_CLI::App_*)> *filter)

{
  bool bVar1;
  size_type __n;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_98;
  const_iterator local_90;
  function<bool_(const_CLI::App_*)> *local_88;
  App **local_80;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_78;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_70;
  const_iterator local_68;
  App **local_60;
  App **local_50;
  shared_ptr<CLI::App> *local_48;
  shared_ptr<CLI::App> *local_40;
  allocator<const_CLI::App_*> local_22;
  undefined1 local_21;
  anon_class_8_1_552cbcb6_for__M_pred local_20;
  function<bool_(const_CLI::App_*)> *filter_local;
  App *this_local;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *subcomms;
  
  local_21 = 0;
  local_20.filter = filter;
  filter_local = (function<bool_(const_CLI::App_*)> *)this;
  this_local = (App *)__return_storage_ptr__;
  __n = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::size
                  (&this->subcommands_);
  std::allocator<const_CLI::App_*>::allocator(&local_22);
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<const_CLI::App_*>::~allocator(&local_22);
  local_40 = (shared_ptr<CLI::App> *)
             ::std::
             begin<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                       (&this->subcommands_);
  local_48 = (shared_ptr<CLI::App> *)
             ::std::
             end<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                       (&this->subcommands_);
  local_50 = (App **)::std::begin<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                               (__return_storage_ptr__);
  local_60 = (App **)::std::
                     transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>const*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(std::shared_ptr<CLI::App>const&)_1_>
                               (local_40,local_48,local_50);
  bVar1 = ::std::function::operator_cast_to_bool((function *)local_20.filter);
  if (bVar1) {
    local_78._M_current =
         (App **)::std::begin<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                           (__return_storage_ptr__);
    local_80 = (App **)::std::end<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                                 (__return_storage_ptr__);
    local_88 = local_20.filter;
    local_70 = ::std::
               remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>
                         (local_78,(__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                    )local_80,local_20);
    __gnu_cxx::
    __normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
    ::__normal_iterator<CLI::App_const**>
              ((__normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                *)&local_68,&local_70);
    local_98._M_current =
         (App **)::std::end<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                           (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
    ::__normal_iterator<CLI::App_const**>
              ((__normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                *)&local_90,&local_98);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::erase
              (__return_storage_ptr__,local_68,local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const App *> get_subcommands(const std::function<bool(const App *)> &filter) const {
        std::vector<const App *> subcomms(subcommands_.size());
        std::transform(std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) {
            return v.get();
        });

        if(filter) {
            subcomms.erase(std::remove_if(std::begin(subcomms),
                                          std::end(subcomms),
                                          [&filter](const App *app) { return !filter(app); }),
                           std::end(subcomms));
        }

        return subcomms;
    }